

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

wchar_t fmt::v6::internal::decimal_point_impl<wchar_t>(locale_ref loc)

{
  wchar_t wVar1;
  numpunct *pnVar2;
  locale local_10 [8];
  
  if (loc.locale_ == (void *)0x0) {
    std::locale::locale(local_10);
  }
  else {
    std::locale::locale(local_10,(locale *)loc.locale_);
  }
  pnVar2 = std::use_facet<std::__cxx11::numpunct<wchar_t>>(local_10);
  wVar1 = (**(code **)(*(long *)pnVar2 + 0x10))(pnVar2);
  std::locale::~locale(local_10);
  return wVar1;
}

Assistant:

Locale locale_ref::get() const {
  static_assert(std::is_same<Locale, std::locale>::value, "");
  return locale_ ? *static_cast<const std::locale*>(locale_) : std::locale();
}